

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkInit(ARKodeMem ark_mem,sunrealtype t0,N_Vector y0,int init_type)

{
  ARKodeHAdaptMem pAVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  int iVar3;
  sunindextype liw1;
  sunindextype lrw1;
  sunindextype local_30;
  sunindextype local_28;
  sunrealtype local_20;
  
  if (ark_mem == (ARKodeMem)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar3 = -0x15;
    ark_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar2 = 0x64d;
  }
  else {
    if (y0 != (N_Vector)0x0) {
      if (init_type == 1) {
        init_type = (int)(ark_mem->initialized != 0);
      }
      if (ark_mem->MallocDone == 0) {
        if (((ark_mem->step_init == (ARKTimestepInitFn)0x0) ||
            (ark_mem->step == (ARKTimestepStepFn)0x0)) || (ark_mem->step_mem == (void *)0x0)) {
          msgfmt = "Time stepper module is missing required functionality";
          iVar3 = -0x16;
          error_code = -0x16;
          iVar2 = 0x667;
          goto LAB_0014dc4a;
        }
        local_20 = t0;
        iVar2 = arkCheckNvector(y0);
        if (iVar2 == 0) {
          msgfmt = "A required vector operation is not implemented.";
          iVar3 = -0x16;
          error_code = -0x16;
          iVar2 = 0x670;
          goto LAB_0014dc4a;
        }
        if (y0->ops->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
          local_28 = 0;
          local_30 = 0;
        }
        else {
          N_VSpace(y0,&local_28,&local_30);
        }
        ark_mem->lrw1 = local_28;
        ark_mem->liw1 = local_30;
        iVar2 = arkAllocVectors(ark_mem,y0);
        if (iVar2 == 0) {
          msgfmt = "A memory request failed.";
          iVar3 = -0x14;
          error_code = -0x14;
          iVar2 = 0x683;
          goto LAB_0014dc4a;
        }
        ark_mem->MallocDone = 1;
        t0 = local_20;
      }
      ark_mem->tcur = t0;
      ark_mem->tn = t0;
      N_VScale(0,y0,ark_mem->yn);
      ark_mem->fn_is_current = 0;
      ark_mem->tstopset = 0;
      if (init_type == 0) {
        ark_mem->h0u = 0.0;
        ark_mem->next_h = 0.0;
        ark_mem->nst_attempts = 0;
        ark_mem->nst = 0;
        ark_mem->nhnil = 0;
        ark_mem->ncfn = 0;
        ark_mem->netf = 0;
        ark_mem->nconstrfails = 0;
        *(undefined4 *)&ark_mem->hold = 0;
        *(undefined4 *)((long)&ark_mem->hold + 4) = 0;
        *(undefined4 *)&ark_mem->tolsf = 0;
        *(undefined4 *)((long)&ark_mem->tolsf + 4) = 0x3ff00000;
        iVar2 = SUNAdaptController_Reset(ark_mem->hadapt_mem->hcontroller);
        if (iVar2 != 0) {
          msgfmt = "Unable to reset error controller object";
          iVar3 = -0x2f;
          error_code = -0x2f;
          iVar2 = 0x6b0;
          goto LAB_0014dc4a;
        }
        pAVar1 = ark_mem->hadapt_mem;
        pAVar1->nst_acc = 0;
        pAVar1->nst_exp = 0;
        ark_mem->initialized = 0;
        ark_mem->call_fullrhs = 0;
      }
      ark_mem->initsetup = 1;
      ark_mem->init_type = init_type;
      ark_mem->firststage = 1;
      return 0;
    }
    msgfmt = "y0 = NULL illegal.";
    iVar3 = -0x16;
    error_code = -0x16;
    iVar2 = 0x655;
  }
LAB_0014dc4a:
  arkProcessError(ark_mem,error_code,iVar2,"arkInit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int arkInit(ARKodeMem ark_mem, sunrealtype t0, N_Vector y0, int init_type)
{
  sunbooleantype stepperOK, nvectorOK, allocOK;
  int retval;
  sunindextype lrw1, liw1;

  /* Check ark_mem */
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (ARK_ILL_INPUT);
  }

  /* Check if reset was called before the first Evolve call */
  if (init_type == RESET_INIT && !(ark_mem->initialized))
  {
    init_type = FIRST_INIT;
  }

  /* Check if allocations have been done i.e., is this first init call */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    /* Test if all required time stepper operations are implemented */
    stepperOK = arkCheckTimestepper(ark_mem);
    if (!stepperOK)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Time stepper module is missing required functionality");
      return (ARK_ILL_INPUT);
    }

    /* Test if all required vector operations are implemented */
    nvectorOK = arkCheckNvector(y0);
    if (!nvectorOK)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_BAD_NVECTOR);
      return (ARK_ILL_INPUT);
    }

    /* Set space requirements for one N_Vector */
    if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
    else
    {
      lrw1 = 0;
      liw1 = 0;
    }
    ark_mem->lrw1 = lrw1;
    ark_mem->liw1 = liw1;

    /* Allocate the solver vectors (using y0 as a template) */
    allocOK = arkAllocVectors(ark_mem, y0);
    if (!allocOK)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_MEM_FAIL);
      return (ARK_MEM_FAIL);
    }

    /* All allocations are complete */
    ark_mem->MallocDone = SUNTRUE;
  }

  /* All allocation and error checking is complete at this point */

  /* Copy the input parameters into ARKODE state */
  ark_mem->tcur = t0;
  ark_mem->tn   = t0;

  /* Initialize yn */
  N_VScale(ONE, y0, ark_mem->yn);
  ark_mem->fn_is_current = SUNFALSE;

  /* Clear any previous 'tstop' */
  ark_mem->tstopset = SUNFALSE;

  /* Initializations on (re-)initialization call, skip on reset */
  if (init_type == FIRST_INIT)
  {
    /* Counters */
    ark_mem->nst_attempts = 0;
    ark_mem->nst          = 0;
    ark_mem->nhnil        = 0;
    ark_mem->ncfn         = 0;
    ark_mem->netf         = 0;
    ark_mem->nconstrfails = 0;

    /* Initial, old, and next step sizes */
    ark_mem->h0u    = ZERO;
    ark_mem->hold   = ZERO;
    ark_mem->next_h = ZERO;

    /* Tolerance scale factor */
    ark_mem->tolsf = ONE;

    /* Reset error controller object */
    retval = SUNAdaptController_Reset(ark_mem->hadapt_mem->hcontroller);
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__, __FILE__,
                      "Unable to reset error controller object");
      return (ARK_CONTROLLER_ERR);
    }

    /* Adaptivity counters */
    ark_mem->hadapt_mem->nst_acc = 0;
    ark_mem->hadapt_mem->nst_exp = 0;

    /* Indicate that calling the full RHS function is not required, this flag is
       updated to SUNTRUE by the interpolation module initialization function
       and/or the stepper initialization function in arkInitialSetup */
    ark_mem->call_fullrhs = SUNFALSE;

    /* Indicate that initialization has not been done before */
    ark_mem->initialized = SUNFALSE;
  }

  /* Indicate initialization is needed */
  ark_mem->initsetup  = SUNTRUE;
  ark_mem->init_type  = init_type;
  ark_mem->firststage = SUNTRUE;

  return (ARK_SUCCESS);
}